

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

CallInfo * luaE_extendCI(lua_State *L)

{
  CallInfo *pCVar1;
  CallInfo *ci;
  lua_State *L_local;
  
  pCVar1 = (CallInfo *)luaM_realloc_(L,(void *)0x0,0,0x48);
  pCVar1->jitstatus = '\0';
  pCVar1->stacklevel = L->ci->stacklevel + 1;
  if (L->ci->next == (CallInfo *)0x0) {
    L->ci->next = pCVar1;
    pCVar1->previous = L->ci;
    pCVar1->next = (CallInfo *)0x0;
    pCVar1->magic = '*';
    L->nci = L->nci + 1;
    return pCVar1;
  }
  __assert_fail("L->ci->next == ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                ,0x6c,"CallInfo *luaE_extendCI(lua_State *)");
}

Assistant:

CallInfo *luaE_extendCI (lua_State *L) {
  CallInfo *ci = luaM_new(L, CallInfo);
  ci->jitstatus = 0;
  ci->stacklevel = L->ci->stacklevel+1;
  lua_assert(L->ci->next == NULL);
  L->ci->next = ci;
  ci->previous = L->ci;
  ci->next = NULL;
  ci->magic = 42;
  L->nci++;
  return ci;
}